

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_get_active_map(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  int iVar2;
  uint *in_RSI;
  uchar *unaff_retaddr;
  AV1_COMP *in_stack_00000008;
  aom_active_map_t *map;
  long *local_38;
  int in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  aom_codec_err_t aVar3;
  
  uVar1 = *in_RSI;
  if (uVar1 < 0x29) {
    local_38 = (long *)((long)(int)uVar1 + *(long *)(in_RSI + 4));
    *in_RSI = uVar1 + 8;
  }
  else {
    local_38 = *(long **)(in_RSI + 2);
    *(long **)(in_RSI + 2) = local_38 + 1;
  }
  if (*local_38 == 0) {
    aVar3 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    iVar2 = av1_get_active_map(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffffc,
                               in_stack_fffffffffffffff8);
    if (iVar2 == 0) {
      aVar3 = AOM_CODEC_OK;
    }
    else {
      aVar3 = AOM_CODEC_INVALID_PARAM;
    }
  }
  return aVar3;
}

Assistant:

static aom_codec_err_t ctrl_get_active_map(aom_codec_alg_priv_t *ctx,
                                           va_list args) {
  aom_active_map_t *const map = va_arg(args, aom_active_map_t *);

  if (map) {
    if (!av1_get_active_map(ctx->ppi->cpi, map->active_map, (int)map->rows,
                            (int)map->cols))
      return AOM_CODEC_OK;
    else
      return AOM_CODEC_INVALID_PARAM;
  } else {
    return AOM_CODEC_INVALID_PARAM;
  }
}